

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.c
# Opt level: O1

int yaml_emitter_initialize(yaml_emitter_t *emitter)

{
  yaml_char_t *__ptr;
  uchar *puVar1;
  yaml_emitter_state_t *pyVar2;
  yaml_event_t *pyVar3;
  int *piVar4;
  yaml_tag_directive_t *pyVar5;
  
  if (emitter == (yaml_emitter_t *)0x0) {
    __assert_fail("emitter",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/w23[P]stameska/3p/libyaml/src/api.c"
                  ,0x165,"int yaml_emitter_initialize(yaml_emitter_t *)");
  }
  memset(emitter,0,0x1b0);
  __ptr = (yaml_char_t *)malloc(0x4000);
  (emitter->buffer).start = __ptr;
  if (__ptr == (yaml_char_t *)0x0) {
    emitter->error = YAML_MEMORY_ERROR;
  }
  else {
    (emitter->buffer).pointer = __ptr;
    (emitter->buffer).last = __ptr;
    (emitter->buffer).end = __ptr + 0x4000;
    puVar1 = (uchar *)malloc(0x8002);
    (emitter->raw_buffer).start = puVar1;
    if (puVar1 != (uchar *)0x0) {
      (emitter->raw_buffer).pointer = puVar1;
      (emitter->raw_buffer).last = puVar1;
      (emitter->raw_buffer).end = puVar1 + 0x8002;
      pyVar2 = (yaml_emitter_state_t *)malloc(0x40);
      (emitter->states).start = pyVar2;
      if (pyVar2 != (yaml_emitter_state_t *)0x0) {
        (emitter->states).top = pyVar2;
        (emitter->states).end = pyVar2 + 0x10;
        pyVar3 = (yaml_event_t *)malloc(0x680);
        (emitter->events).start = pyVar3;
        if (pyVar3 != (yaml_event_t *)0x0) {
          (emitter->events).tail = pyVar3;
          (emitter->events).head = pyVar3;
          (emitter->events).end = pyVar3 + 0x10;
          piVar4 = (int *)malloc(0x40);
          (emitter->indents).start = piVar4;
          if (piVar4 != (int *)0x0) {
            (emitter->indents).top = piVar4;
            (emitter->indents).end = piVar4 + 0x10;
            pyVar5 = (yaml_tag_directive_t *)malloc(0x100);
            (emitter->tag_directives).start = pyVar5;
            if (pyVar5 != (yaml_tag_directive_t *)0x0) {
              (emitter->tag_directives).top = pyVar5;
              (emitter->tag_directives).end = pyVar5 + 0x10;
              return 1;
            }
          }
        }
      }
    }
    emitter->error = YAML_MEMORY_ERROR;
    if (__ptr != (yaml_char_t *)0x0) {
      free(__ptr);
    }
  }
  (emitter->buffer).start = (yaml_char_t *)0x0;
  (emitter->buffer).end = (yaml_char_t *)0x0;
  (emitter->buffer).pointer = (yaml_char_t *)0x0;
  puVar1 = (emitter->raw_buffer).start;
  if (puVar1 != (uchar *)0x0) {
    free(puVar1);
  }
  (emitter->raw_buffer).start = (uchar *)0x0;
  (emitter->raw_buffer).end = (uchar *)0x0;
  (emitter->raw_buffer).pointer = (uchar *)0x0;
  pyVar2 = (emitter->states).start;
  if (pyVar2 != (yaml_emitter_state_t *)0x0) {
    free(pyVar2);
  }
  (emitter->states).start = (yaml_emitter_state_t *)0x0;
  (emitter->states).end = (yaml_emitter_state_t *)0x0;
  (emitter->states).top = (yaml_emitter_state_t *)0x0;
  pyVar3 = (emitter->events).start;
  if (pyVar3 != (yaml_event_t *)0x0) {
    free(pyVar3);
  }
  (emitter->events).head = (yaml_event_t *)0x0;
  (emitter->events).tail = (yaml_event_t *)0x0;
  (emitter->events).start = (yaml_event_t *)0x0;
  (emitter->events).end = (yaml_event_t *)0x0;
  piVar4 = (emitter->indents).start;
  if (piVar4 != (int *)0x0) {
    free(piVar4);
  }
  (emitter->indents).start = (int *)0x0;
  (emitter->indents).end = (int *)0x0;
  (emitter->indents).top = (int *)0x0;
  pyVar5 = (emitter->tag_directives).start;
  if (pyVar5 != (yaml_tag_directive_t *)0x0) {
    free(pyVar5);
  }
  (emitter->tag_directives).start = (yaml_tag_directive_t *)0x0;
  (emitter->tag_directives).end = (yaml_tag_directive_t *)0x0;
  (emitter->tag_directives).top = (yaml_tag_directive_t *)0x0;
  return 0;
}

Assistant:

YAML_DECLARE(int)
yaml_emitter_initialize(yaml_emitter_t *emitter)
{
    assert(emitter);    /* Non-NULL emitter object expected. */

    memset(emitter, 0, sizeof(yaml_emitter_t));
    if (!BUFFER_INIT(emitter, emitter->buffer, OUTPUT_BUFFER_SIZE))
        goto error;
    if (!BUFFER_INIT(emitter, emitter->raw_buffer, OUTPUT_RAW_BUFFER_SIZE))
        goto error;
    if (!STACK_INIT(emitter, emitter->states, yaml_emitter_state_t*))
        goto error;
    if (!QUEUE_INIT(emitter, emitter->events, INITIAL_QUEUE_SIZE, yaml_event_t*))
        goto error;
    if (!STACK_INIT(emitter, emitter->indents, int*))
        goto error;
    if (!STACK_INIT(emitter, emitter->tag_directives, yaml_tag_directive_t*))
        goto error;

    return 1;

error:

    BUFFER_DEL(emitter, emitter->buffer);
    BUFFER_DEL(emitter, emitter->raw_buffer);
    STACK_DEL(emitter, emitter->states);
    QUEUE_DEL(emitter, emitter->events);
    STACK_DEL(emitter, emitter->indents);
    STACK_DEL(emitter, emitter->tag_directives);

    return 0;
}